

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_signed<long>(char *Name)

{
  long lVar1;
  ostream *poVar2;
  long local_38;
  long tmp2;
  uint8_t tmp [8];
  uint8_t cst_minus10_be [8];
  uint8_t cst_minus10_le [8];
  char *Name_local;
  
  memset(cst_minus10_be,0xff,8);
  memset(tmp,0xff,8);
  cst_minus10_be[0] = 0xf6;
  tmp[7] = 0xf6;
  lVar1 = intmem::loadu_le<long>(cst_minus10_be);
  if (lVar1 == -10) {
    lVar1 = intmem::loadu_be<long>(tmp);
    if (lVar1 == -10) {
      lVar1 = intmem::load_le<long>((long *)cst_minus10_be);
      if (lVar1 == -10) {
        lVar1 = intmem::load_be<long>((long *)tmp);
        if (lVar1 == -10) {
          intmem::storeu_le<long>(&tmp2,-10);
          if (tmp2 == CONCAT71(cst_minus10_be._1_7_,cst_minus10_be[0])) {
            intmem::storeu_be<long>(&tmp2,-10);
            if (tmp2 == CONCAT17(tmp[7],tmp._0_7_)) {
              intmem::store_le<long>(&local_38,-10);
              if (local_38 == CONCAT71(cst_minus10_be._1_7_,cst_minus10_be[0])) {
                intmem::storeu_be<long>(&local_38,-10);
                if (local_38 == CONCAT17(tmp[7],tmp._0_7_)) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                  poVar2 = std::operator<<(poVar2,": error storing BE integer!");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                poVar2 = std::operator<<(poVar2,": error storing LE integer!");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,Name);
              poVar2 = std::operator<<(poVar2,": error storing BE integer!");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cerr,Name);
            poVar2 = std::operator<<(poVar2,": error storing LE integer!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,Name);
          poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,Name);
        poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,Name);
      poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,Name);
    poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_signed(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_minus10_le[sizeof(T)];
  ALIGN(alignof(T)) uint8_t cst_minus10_be[sizeof(T)];
  memset(&cst_minus10_le[0], 0xFF, sizeof(T));
  memset(&cst_minus10_be[0], 0xFF, sizeof(T));
  cst_minus10_le[0] = 0xF6;
  cst_minus10_be[sizeof(T)-1] = 0xF6;
  if (loadu_le<T>(cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }

  uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, -10);
  if (memcmp(tmp, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>((T*) tmp, -10);
  if (memcmp(tmp, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}